

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Document::Document(Document *this,Parser *parser,ImportSettings *settings)

{
  uint *timeStamp;
  uint *__end2;
  uint *__begin2;
  uint (*__range2) [7];
  ImportSettings *settings_local;
  Parser *parser_local;
  Document *this_local;
  
  this->settings = settings;
  std::
  map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
  ::map(&this->objects);
  this->parser = parser;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
  ::map(&this->templates);
  std::
  multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  ::multimap(&this->src_connections);
  std::
  multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  ::multimap(&this->dest_connections);
  std::__cxx11::string::string((string *)&this->creator);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->animationStacks);
  std::
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  ::vector(&this->animationStacksResolved);
  std::
  unique_ptr<Assimp::FBX::FileGlobalSettings,std::default_delete<Assimp::FBX::FileGlobalSettings>>::
  unique_ptr<std::default_delete<Assimp::FBX::FileGlobalSettings>,void>
            ((unique_ptr<Assimp::FBX::FileGlobalSettings,std::default_delete<Assimp::FBX::FileGlobalSettings>>
              *)&this->globals);
  for (__end2 = this->creationTimeStamp; __end2 != (uint *)&this->field_0x114; __end2 = __end2 + 1)
  {
    *__end2 = 0;
  }
  ReadHeader(this);
  ReadPropertyTemplates(this);
  ReadGlobalSettings(this);
  ReadObjects(this);
  ReadConnections(this);
  return;
}

Assistant:

Document::Document(const Parser& parser, const ImportSettings& settings)
: settings(settings)
, parser(parser)
{
    // Cannot use array default initialization syntax because vc8 fails on it
    for (auto &timeStamp : creationTimeStamp) {
        timeStamp = 0;
    }

    ReadHeader();
    ReadPropertyTemplates();

    ReadGlobalSettings();

    // This order is important, connections need parsed objects to check
    // whether connections are ok or not. Objects may not be evaluated yet,
    // though, since this may require valid connections.
    ReadObjects();
    ReadConnections();
}